

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotionImposed.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotionImposed::Update(ChLinkMotionImposed *this,double mytime,bool update_assets)

{
  ChFrame<double> *this_00;
  ChFrame<double> *pCVar1;
  undefined1 auVar2 [16];
  Scalar *pSVar3;
  ChConstraintTwoBodies *pCVar4;
  ChLinkMask *pCVar5;
  int iVar6;
  uint uVar7;
  ulong index;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_> local_568;
  undefined1 local_548 [56];
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true> local_510;
  PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *local_4e0;
  double local_4d8;
  ChMatrix33<double> *pCStack_4d0;
  double local_4c8;
  double local_4c0;
  ulong local_4b8;
  ulong uStack_4b0;
  undefined8 local_4a8;
  double local_4a0;
  ChMatrix33<double> Jw1;
  ChMatrix33<double> Jw2;
  ChFrame<double> frame1M;
  ChMatrix33<double> mtempQ;
  ChMatrix33<double> Jr2;
  ChMatrix33<double> Jr1;
  ChMatrix33<double> Jx2;
  ChMatrix33<double> Jx1;
  ChFrame<double> frameMW;
  ChMatrix33<double> planeMW;
  ChFrame<double> frame2W;
  ChFrame<double> frame1W;
  
  ChLinkMateGeneric::Update(&this->super_ChLinkMateGeneric,mytime,update_assets);
  pCVar1 = (ChFrame<double> *)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body1;
  if ((pCVar1 != (ChFrame<double> *)0x0) &&
     ((this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2 != (ChBodyFrame *)0x0)) {
    ChFrame<double>::operator>>(&frame1W,&(this->super_ChLinkMateGeneric).frame1,pCVar1);
    pCVar1 = &(this->super_ChLinkMateGeneric).frame2;
    ChFrame<double>::operator>>
              (&frame2W,pCVar1,
               (ChFrame<double> *)
               (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2);
    this_00 = &this->frameM2;
    (*((this->rotation_function).
       super___shared_ptr<chrono::ChFunctionRotation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunctionRotation[3])(mytime,&frameMW);
    ChFrame<double>::SetRot(this_00,(ChQuaternion<double> *)&frameMW);
    (*((this->position_function).
       super___shared_ptr<chrono::ChFunctionPosition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunctionPosition[3])(&frameMW);
    if ((ChFrame<double> *)&(this->frameM2).coord != &frameMW) {
      (this->frameM2).coord.pos.m_data[0] = (double)frameMW._vptr_ChFrame;
      (this->frameM2).coord.pos.m_data[1] = frameMW.coord.pos.m_data[0];
      (this->frameM2).coord.pos.m_data[2] = frameMW.coord.pos.m_data[1];
    }
    ChFrame<double>::operator>>(&frameMW,this_00,pCVar1);
    ChFrame<double>::operator=(&this->frameMb2,&frameMW);
    ChFrame<double>::operator>>(&frameMW,this_00,&frame2W);
    planeMW.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    Jw1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    planeMW.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    Jw1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    Jw1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    planeMW.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    planeMW.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    ChFrame<double>::ChFrame(&frame1M,(ChVector<double> *)&Jw1,(ChQuaternion<double> *)&planeMW);
    ChFrame<double>::TransformParentToLocal(&frameMW,&frame1W,&frame1M);
    planeMW.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         frameMW.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    planeMW.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         frameMW.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    planeMW.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         frameMW.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    planeMW.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         frameMW.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    planeMW.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         frameMW.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    planeMW.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         frameMW.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    planeMW.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         frameMW.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    planeMW.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         frameMW.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    planeMW.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         frameMW.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    Jw2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)&(((this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body1)->
                  super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
    Jw2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&planeMW;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jw1,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&Jw2);
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (double)&(((this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2)->
                  super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&planeMW;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jw2,
               (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&Jx1);
    Jx2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&planeMW;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jx1,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&Jx2);
    Jr1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&planeMW;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jx2,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                *)&Jr1);
    pCStack_4d0 = &Jr2;
    Jr2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    Jr2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (this->super_ChLinkMateGeneric).frame1.coord.pos.m_data[2];
    auVar10._0_8_ =
         -Jr2.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar10._8_8_ = 0x8000000000000000;
    Jr2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)vmovlpd_avx(auVar10);
    Jr2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
    auVar9 = *(undefined1 (*) [16])(this->super_ChLinkMateGeneric).frame1.coord.pos.m_data;
    Jr2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (this->super_ChLinkMateGeneric).frame1.coord.pos.m_data[1];
    Jr2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         -auVar9._0_8_;
    Jr2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         -auVar9._8_8_;
    Jr2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         (double)vmovlpd_avx(auVar9);
    Jr2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
    local_4e0 = (PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jw1;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jr1,
               (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_4e0);
    local_4e0 = (PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)0x0;
    local_4c8 = (this->frameMb2).coord.pos.m_data[2];
    auVar11._0_8_ = -local_4c8;
    auVar11._8_8_ = 0x8000000000000000;
    local_4d8 = (double)vmovlpd_avx(auVar11);
    local_4c0 = 0.0;
    auVar9 = *(undefined1 (*) [16])(this->frameMb2).coord.pos.m_data;
    pCStack_4d0 = (ChMatrix33<double> *)(this->frameMb2).coord.pos.m_data[1];
    local_4b8 = auVar9._0_8_ ^ 0x8000000000000000;
    uStack_4b0 = auVar9._8_8_ ^ 0x8000000000000000;
    local_4a8 = vmovlpd_avx(auVar9);
    local_4a0 = 0.0;
    mtempQ.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&Jw2;
    mtempQ.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (double)&local_4e0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jr2,
               (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&mtempQ);
    auVar2._8_8_ = frame1M.coord.rot.m_data[2];
    auVar2._0_8_ = frame1M.coord.rot.m_data[1];
    local_4c8 = frame1M.coord.rot.m_data[3] * 0.5;
    auVar9._8_8_ = 0x3fe0000000000000;
    auVar9._0_8_ = 0x3fe0000000000000;
    auVar9 = vmulpd_avx512vl(auVar2,auVar9);
    local_4e0 = (PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)
                (frame1M.coord.rot.m_data[0] * 0.5);
    local_4d8 = -local_4c8;
    pCStack_4d0 = auVar9._8_8_;
    local_4b8 = auVar9._0_8_ ^ 0x8000000000000000;
    uStack_4b0 = (ulong)pCStack_4d0 ^ 0x8000000000000000;
    local_4a8 = vmovlpd_avx(auVar9);
    local_548._0_8_ =
         (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
          *)&local_4e0;
    local_548._8_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jw1;
    local_4c0 = (double)local_4e0;
    local_4a0 = (double)local_4e0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&mtempQ.super_Matrix<double,_3,_3,_1,_3,_3>,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                *)local_548);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
              (&Jw1.super_Matrix<double,_3,_3,_1,_3,_3>,&mtempQ.super_Matrix<double,_3,_3,_1,_3,_3>)
    ;
    local_548._0_8_ =
         (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
          *)&local_4e0;
    local_548._8_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jw2;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&mtempQ.super_Matrix<double,_3,_3,_1,_3,_3>,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                *)local_548);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
              (&Jw2.super_Matrix<double,_3,_3,_1,_3,_3>,&mtempQ.super_Matrix<double,_3,_3,_1,_3,_3>)
    ;
    bVar8 = (this->super_ChLinkMateGeneric).c_x == true;
    if (bVar8) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_6,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>,_1> *)
                          &(this->super_ChLinkMateGeneric).C,0);
      *pSVar3 = frame1M.coord.pos.m_data[0];
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jx1.super_Matrix<double,_3,_3,_1,_3,_3>,0);
      pCVar5 = &(this->super_ChLinkMateGeneric).mask;
      pCVar4 = ChLinkMask::Constr_N(pCVar5,0);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,0,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jr1.super_Matrix<double,_3,_3,_1,_3,_3>,0);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,0);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jx2.super_Matrix<double,_3,_3,_1,_3,_3>,0);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,0);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,0,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jr2.super_Matrix<double,_3,_3,_1,_3,_3>,0);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,0);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
    }
    index = (ulong)bVar8;
    if ((this->super_ChLinkMateGeneric).c_y == true) {
      uVar7 = (uint)bVar8;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_6,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>,_1> *)
                          &(this->super_ChLinkMateGeneric).C,index);
      *pSVar3 = frame1M.coord.pos.m_data[1];
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jx1.super_Matrix<double,_3,_3,_1,_3,_3>,1);
      pCVar5 = &(this->super_ChLinkMateGeneric).mask;
      pCVar4 = ChLinkMask::Constr_N(pCVar5,uVar7);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,0,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jr1.super_Matrix<double,_3,_3,_1,_3,_3>,1);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,uVar7);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jx2.super_Matrix<double,_3,_3,_1,_3,_3>,1);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,uVar7);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,0,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jr2.super_Matrix<double,_3,_3,_1,_3,_3>,1);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,uVar7);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
      index = (ulong)(uVar7 + 1);
    }
    if ((this->super_ChLinkMateGeneric).c_z == true) {
      iVar6 = (int)index;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_6,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>,_1> *)
                          &(this->super_ChLinkMateGeneric).C,index);
      *pSVar3 = frame1M.coord.pos.m_data[2];
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jx1.super_Matrix<double,_3,_3,_1,_3,_3>,2);
      pCVar5 = &(this->super_ChLinkMateGeneric).mask;
      pCVar4 = ChLinkMask::Constr_N(pCVar5,iVar6);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,0,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jr1.super_Matrix<double,_3,_3,_1,_3,_3>,2);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,iVar6);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jx2.super_Matrix<double,_3,_3,_1,_3,_3>,2);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,iVar6);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,0,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jr2.super_Matrix<double,_3,_3,_1,_3,_3>,2);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,iVar6);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
      index = (ulong)(iVar6 + 1);
    }
    if ((this->super_ChLinkMateGeneric).c_rx == true) {
      iVar6 = (int)index;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_6,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>,_1> *)
                          &(this->super_ChLinkMateGeneric).C,index);
      pCVar5 = &(this->super_ChLinkMateGeneric).mask;
      *pSVar3 = frame1M.coord.rot.m_data[1];
      pCVar4 = ChLinkMask::Constr_N(pCVar5,iVar6);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                (local_548,pCVar4);
      Eigen::
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>::
      setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
               *)local_548);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,iVar6);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                (local_548,pCVar4);
      Eigen::
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>::
      setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
               *)local_548);
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jw1.super_Matrix<double,_3,_3,_1,_3,_3>,0);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,iVar6);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jw2.super_Matrix<double,_3,_3,_1,_3,_3>,0);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,iVar6);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
      index = (ulong)(iVar6 + 1);
    }
    uVar7 = (uint)index;
    if ((this->super_ChLinkMateGeneric).c_ry == true) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_6,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>,_1> *)
                          &(this->super_ChLinkMateGeneric).C,index);
      pCVar5 = &(this->super_ChLinkMateGeneric).mask;
      *pSVar3 = frame1M.coord.rot.m_data[2];
      pCVar4 = ChLinkMask::Constr_N(pCVar5,uVar7);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                (local_548,pCVar4);
      Eigen::
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>::
      setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
               *)local_548);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,uVar7);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                (local_548,pCVar4);
      Eigen::
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>::
      setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
               *)local_548);
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jw1.super_Matrix<double,_3,_3,_1,_3,_3>,1);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,uVar7);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jw2.super_Matrix<double,_3,_3,_1,_3,_3>,1);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,uVar7);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
      uVar7 = uVar7 + 1;
    }
    if ((this->super_ChLinkMateGeneric).c_rz == true) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_6,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>,_1> *)
                          &(this->super_ChLinkMateGeneric).C,(ulong)uVar7);
      pCVar5 = &(this->super_ChLinkMateGeneric).mask;
      *pSVar3 = frame1M.coord.rot.m_data[3];
      pCVar4 = ChLinkMask::Constr_N(pCVar5,uVar7);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                (local_548,pCVar4);
      Eigen::
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>::
      setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
               *)local_548);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,uVar7);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                (local_548,pCVar4);
      Eigen::
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>::
      setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
               *)local_548);
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jw1.super_Matrix<double,_3,_3,_1,_3,_3>,2);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,uVar7);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_510,&Jw2.super_Matrix<double,_3,_3,_1,_3,_3>,2);
      pCVar4 = ChLinkMask::Constr_N(pCVar5,uVar7);
      (*(pCVar4->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                (&local_568,pCVar4);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_548,&local_568,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_548,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_510)
      ;
    }
  }
  return;
}

Assistant:

void ChLinkMotionImposed::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMateGeneric::Update(mytime, update_assets);

    // Override the rotational jacobian [Cq] and the rotational residual C,
    // by assuming an additional hidden frame that rotates about frame2:

    if (this->Body1 && this->Body2) {
        ChFrame<> frame1W = this->frame1 >> (*this->Body1);
        ChFrame<> frame2W = this->frame2 >> (*this->Body2);

		frameM2.SetRot(rotation_function->Get_q(mytime));
		frameM2.SetPos(position_function->Get_p(mytime));
		
		frameMb2 = frameM2 >> this->frame2;

		ChFrame<> frameMW = frameM2 >> frame2W;

        ChFrame<> frame1M;
        frameMW.TransformParentToLocal(frame1W, frame1M);

        ChMatrix33<> planeMW = frameMW.GetA();

        ChMatrix33<> Jw1 = planeMW.transpose() * Body1->GetA();
        ChMatrix33<> Jw2 = -planeMW.transpose() * Body2->GetA();

		ChMatrix33<> Jx1 = planeMW.transpose();
        ChMatrix33<> Jx2 = -planeMW.transpose();

        ChMatrix33<> Jr1 = -Jw1 * ChStarMatrix33<>(frame1.GetPos());
        ChMatrix33<> Jr2 = -Jw2 * ChStarMatrix33<>(frameMb2.GetPos());

		//???? not needed, because frame1W and frameRW should always coincide when x y z translations are constrained
        //ChVector<> p2p1_base2 = Body2->GetA().transpose() * (p1_abs - p2_abs); 
        //Jr2 += frame2.GetA().transpose() * ChStarMatrix33<>(p2p1_base2);

        // Premultiply by Jw1 and Jw2 by  0.5*[Fp(q_resid)]' to get residual as imaginary part of a quaternion.
        ChStarMatrix33<> mtempM(frame1M.GetRot().GetVector() * 0.5);
        mtempM(0, 0) = 0.5 * frame1M.GetRot().e0();
        mtempM(1, 1) = 0.5 * frame1M.GetRot().e0();
        mtempM(2, 2) = 0.5 * frame1M.GetRot().e0();

        ChMatrix33<> mtempQ;
        mtempQ = mtempM.transpose() * Jw1;
        Jw1 = mtempQ;
        mtempQ = mtempM.transpose() * Jw2;
        Jw2 = mtempQ;

        int nc = 0;

        if (c_x) {
            C(nc) = frame1M.GetPos().x();
            mask.Constr_N(nc).Get_Cq_a().segment(0, 3) = Jx1.row(0);
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jr1.row(0);
            mask.Constr_N(nc).Get_Cq_b().segment(0, 3) = Jx2.row(0);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jr2.row(0);
            nc++;
        }
        if (c_y) {
            C(nc) = frame1M.GetPos().y();
            mask.Constr_N(nc).Get_Cq_a().segment(0, 3) = Jx1.row(1);
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jr1.row(1);
            mask.Constr_N(nc).Get_Cq_b().segment(0, 3) = Jx2.row(1);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jr2.row(1);
            nc++;
        }
        if (c_z) {
            C(nc) = frame1M.GetPos().z();
            mask.Constr_N(nc).Get_Cq_a().segment(0, 3) = Jx1.row(2);
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jr1.row(2);
            mask.Constr_N(nc).Get_Cq_b().segment(0, 3) = Jx2.row(2);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jr2.row(2);
            nc++;
        }
        if (c_rx) {
            C(nc) = frame1M.GetRot().e1();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(0);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(0);
            nc++;
        }
        if (c_ry) {
            C(nc) = frame1M.GetRot().e2();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(1);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(1);
            nc++;
        }
        if (c_rz) {
            C(nc) = frame1M.GetRot().e3();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(2);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(2);
            nc++;
        }
    }
}